

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O3

bool __thiscall
MD5::checkFileChecksum(MD5 *this,char *checksum,char *filename,qpdf_offset_t up_to_offset)

{
  int iVar1;
  string actual_checksum;
  string local_30;
  
  getFileChecksum_abi_cxx11_(&local_30,(MD5 *)checksum,filename,up_to_offset);
  iVar1 = std::__cxx11::string::compare((char *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return iVar1 == 0;
}

Assistant:

bool
MD5::checkFileChecksum(char const* const checksum, char const* filename, qpdf_offset_t up_to_offset)
{
    bool result = false;
    try {
        std::string actual_checksum = getFileChecksum(filename, up_to_offset);
        result = (checksum == actual_checksum);
    } catch (std::runtime_error const&) {
        // Ignore -- return false
    }
    return result;
}